

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

int SoapySDRDevice_deactivateStream
              (SoapySDRDevice *device,SoapySDRStream *stream,int flags,longlong timeNs)

{
  int iVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  exception *ex;
  
  SoapySDRDevice_clearError();
  iVar1 = (**(code **)(*in_RDI + 0x88))(in_RDI,in_RSI,in_EDX,in_RCX);
  return iVar1;
}

Assistant:

int SoapySDRDevice_deactivateStream(SoapySDRDevice *device,
    SoapySDRStream *stream,
    const int flags,
    const long long timeNs)
{
    __SOAPY_SDR_C_TRY
    return device->deactivateStream(reinterpret_cast<SoapySDR::Stream *>(stream), flags, timeNs);
    __SOAPY_SDR_C_CATCH_RET(SOAPY_SDR_STREAM_ERROR);
}